

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

bool __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
::compare_keys<std::__cxx11::string,std::__cxx11::string>
          (btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  bool bVar1;
  key_compare *this_00;
  string_view local_48;
  string_view local_38;
  value_type local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x_local;
  btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *this_local;
  
  local_20 = y;
  y_local = x;
  x_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::key_comp((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        *)this);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)y_local);
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
  local_21 = (value_type)StringBtreeDefaultLess::operator()(this_00,&local_38,&local_48);
  bVar1 = compare_internal::compare_result_as_less_than((weak_ordering)local_21);
  return bVar1;
}

Assistant:

bool compare_keys(const K &x, const LK &y) const {
            return compare_internal::compare_result_as_less_than(key_comp()(x, y));
        }